

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index johI,Index t,Index *joIs)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Index IVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  undefined1 in_XMM2 [16];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  
  uVar7 = (ulong)t;
  puVar1 = (this->_m_firstJOHIforT).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar7 < (ulong)((long)(this->_m_firstJOHIforT).
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    IVar4 = Globals::CastLIndexToIndex(puVar1[uVar7]);
    uVar5 = (**(code **)((long)*this->_m_madp + 200))();
    auVar11._8_56_ = extraout_var;
    auVar11._0_8_ = extraout_XMM0_Qa;
    if (t != 0) {
      uVar10 = johI - IVar4;
      auVar3 = vcvtusi2sd_avx512f(auVar11._0_16_,uVar5);
      iVar8 = t - 1;
      uVar9 = 0;
      do {
        auVar2 = vcvtusi2sd_avx512f(in_XMM2,iVar8);
        auVar12._0_8_ = pow(auVar3._0_8_,auVar2._0_8_);
        auVar12._8_56_ = extraout_var_00;
        uVar6 = vcvttsd2usi_avx512f(auVar12._0_16_);
        IVar4 = (Index)(uVar10 / uVar6);
        joIs[uVar9] = IVar4;
        uVar10 = uVar10 - (int)uVar6 * IVar4;
        uVar9 = uVar9 + 1;
        iVar8 = iVar8 + -1;
      } while (uVar7 != uVar9);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetJointObservationHistoryArrays
    (Index johI, Index t,  Index joIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index johIwithinThisT = johI - CastLIndexToIndex(_m_firstJOHIforT.at(t));
   
    Index remainder = johIwithinThisT;
    size_t vec_size = t; // the number of joint observations we are searching
    size_t nrJO = GetNrJointObservations();
    //size_t nrJA = GetNrJointActions();
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrJO, (double)(stage));
        Index joI_t2 = remainder / b;
        joIs[t2] = joI_t2; 
        remainder -= joI_t2 * b;
    }
}